

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzFind.c
# Opt level: O0

void Bt3Zip_MatchFinder_Skip(CMatchFinder *p,UInt32 num)

{
  uint lenLimit_00;
  UInt32 curMatch_00;
  undefined1 *puVar1;
  uint uVar2;
  int iVar3;
  int in_ESI;
  long *in_RDI;
  UInt32 curMatch;
  Byte *cur;
  UInt32 hv;
  UInt32 lenLimit;
  int local_c;
  
  local_c = in_ESI;
  do {
    lenLimit_00 = *(uint *)((long)in_RDI + 0x14);
    if (lenLimit_00 < 3) {
      MatchFinder_MovePos((CMatchFinder *)0x1200ca);
    }
    else {
      puVar1 = (undefined1 *)*in_RDI;
      uVar2 = ((uint)CONCAT11(*puVar1,puVar1[2]) ^
              *(uint *)((long)in_RDI + (ulong)(byte)puVar1[1] * 4 + 0x78)) & 0xffff;
      curMatch_00 = *(UInt32 *)(in_RDI[5] + (ulong)uVar2 * 4);
      *(int *)(in_RDI[5] + (ulong)uVar2 * 4) = (int)in_RDI[1];
      SkipMatchesSpec(lenLimit_00,curMatch_00,*(UInt32 *)(in_RDI + 1),(Byte *)*in_RDI,
                      (CLzRef *)in_RDI[6],*(UInt32 *)(in_RDI + 3),*(UInt32 *)((long)in_RDI + 0x1c),
                      *(UInt32 *)((long)in_RDI + 0x3c));
      *(int *)(in_RDI + 3) = (int)in_RDI[3] + 1;
      *in_RDI = *in_RDI + 1;
      iVar3 = (int)in_RDI[1] + 1;
      *(int *)(in_RDI + 1) = iVar3;
      if (iVar3 == *(int *)((long)in_RDI + 0xc)) {
        MatchFinder_CheckLimits((CMatchFinder *)0x1201c0);
      }
    }
    local_c = local_c + -1;
  } while (local_c != 0);
  return;
}

Assistant:

void Bt3Zip_MatchFinder_Skip(CMatchFinder *p, UInt32 num)
{
  do
  {
    SKIP_HEADER(3)
    HASH_ZIP_CALC;
    curMatch = p->hash[hv];
    p->hash[hv] = p->pos;
    SKIP_FOOTER
  }
  while (--num != 0);
}